

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::Calc_Sxi_D
          (ChElementBeamANCF_3333 *this,MatrixNx3c *Sxi_D,double xi,double eta,double zeta)

{
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_98;
  VectorN Sxi_D_col;
  
  Calc_Sxi_xi_compact(this,&Sxi_D_col,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_98,Sxi_D,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>,Eigen::Matrix<double,9,1,0,9,1>>
            ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true> *)&local_98,&Sxi_D_col);
  Calc_Sxi_eta_compact(this,&Sxi_D_col,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_98,Sxi_D,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>,Eigen::Matrix<double,9,1,0,9,1>>
            ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true> *)&local_98,&Sxi_D_col);
  Calc_Sxi_zeta_compact(this,&Sxi_D_col,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_98,Sxi_D,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>,Eigen::Matrix<double,9,1,0,9,1>>
            ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true> *)&local_98,&Sxi_D_col);
  return;
}

Assistant:

void ChElementBeamANCF_3333::Calc_Sxi_D(MatrixNx3c& Sxi_D, double xi, double eta, double zeta) {
    VectorN Sxi_D_col;
    Calc_Sxi_xi_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(0) = Sxi_D_col;

    Calc_Sxi_eta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(1) = Sxi_D_col;

    Calc_Sxi_zeta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(2) = Sxi_D_col;
}